

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderFunctionTests.cpp
# Opt level: O0

void deqp::gles31::Functional::NegativeTestShared::anon_unknown_0::texture_size_invalid_sampler
               (NegativeTestContext *ctx)

{
  ShaderType shaderType;
  NegativeTestContext *pNVar1;
  bool bVar2;
  char *pcVar3;
  RenderContext *pRVar4;
  DataType dataType;
  DataType in_R9D;
  bool local_171;
  string local_148;
  undefined1 local_128 [8];
  string shaderSource;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  byte local_b9;
  string local_b8;
  deUint32 local_98;
  ContextType local_94;
  int local_90;
  allocator<char> local_89;
  int dataTypeNdx;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  int local_48;
  int shaderNdx;
  allocator<char> local_31;
  string local_30;
  NegativeTestContext *local_10;
  NegativeTestContext *ctx_local;
  
  local_10 = ctx;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,
             "textureSize: Invalid sampler type - some overloads take two arguments while others take only one."
             ,&local_31);
  NegativeTestContext::beginSection(ctx,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  for (local_48 = 0; local_48 < 6; local_48 = local_48 + 1) {
    bVar2 = NegativeTestContext::isShaderSupported
                      (local_10,*(ShaderType *)
                                 (NegativeTestShared::(anonymous_namespace)::s_shaders +
                                 (long)local_48 * 4));
    pNVar1 = local_10;
    if (bVar2) {
      pcVar3 = glu::getShaderTypeName
                         (*(ShaderType *)
                           (NegativeTestShared::(anonymous_namespace)::s_shaders +
                           (long)local_48 * 4));
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&dataTypeNdx,pcVar3,&local_89);
      std::operator+(&local_68,"Verify shader: ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &dataTypeNdx);
      NegativeTestContext::beginSection(pNVar1,&local_68);
      std::__cxx11::string::~string((string *)&local_68);
      std::__cxx11::string::~string((string *)&dataTypeNdx);
      std::allocator<char>::~allocator(&local_89);
      for (local_90 = 0; local_90 < 0x1c; local_90 = local_90 + 1) {
        pRVar4 = NegativeTestContext::getRenderContext(local_10);
        local_94.super_ApiType.m_bits = (ApiType)(*pRVar4->_vptr_RenderContext[2])();
        local_98 = (deUint32)glu::ApiType::es(3,2);
        bVar2 = glu::contextSupports(local_94,(ApiType)local_98);
        pNVar1 = local_10;
        local_b9 = 0;
        local_171 = true;
        if (!bVar2) {
          NegativeTestShared::(anonymous_namespace)::getDataTypeExtension_abi_cxx11_
                    (&local_b8,
                     (_anonymous_namespace_ *)
                     (ulong)*(uint *)(NegativeTestShared::(anonymous_namespace)::s_samplerTypes +
                                     (long)local_90 * 4),dataType);
          local_b9 = 1;
          local_171 = NegativeTestContext::isExtensionSupported(pNVar1,&local_b8);
        }
        if ((local_b9 & 1) != 0) {
          std::__cxx11::string::~string((string *)&local_b8);
        }
        pNVar1 = local_10;
        if (local_171 != false) {
          pcVar3 = glu::getDataTypeName
                             (*(DataType *)
                               (NegativeTestShared::(anonymous_namespace)::s_samplerTypes +
                               (long)local_90 * 4));
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_100,pcVar3,
                     (allocator<char> *)(shaderSource.field_2._M_local_buf + 0xf));
          std::operator+(&local_e0,"Verify sampler data type: ",&local_100);
          NegativeTestContext::beginSection(pNVar1,&local_e0);
          std::__cxx11::string::~string((string *)&local_e0);
          std::__cxx11::string::~string((string *)&local_100);
          std::allocator<char>::~allocator
                    ((allocator<char> *)(shaderSource.field_2._M_local_buf + 0xf));
          NegativeTestShared::(anonymous_namespace)::genShaderSourceTextureSize_sampler_abi_cxx11_
                    ((string *)local_128,(_anonymous_namespace_ *)local_10,
                     (NegativeTestContext *)
                     (ulong)*(uint *)(NegativeTestShared::(anonymous_namespace)::s_shaders +
                                     (long)local_48 * 4),
                     *(ShaderType *)
                      (NegativeTestShared::(anonymous_namespace)::s_samplerTypes +
                      (long)local_90 * 4),TYPE_INT,in_R9D);
          pNVar1 = local_10;
          shaderType = *(ShaderType *)
                        (NegativeTestShared::(anonymous_namespace)::s_shaders + (long)local_48 * 4);
          std::__cxx11::string::string((string *)&local_148,(string *)local_128);
          verifyShader(pNVar1,shaderType,&local_148);
          std::__cxx11::string::~string((string *)&local_148);
          NegativeTestContext::endSection(local_10);
          std::__cxx11::string::~string((string *)local_128);
        }
      }
      NegativeTestContext::endSection(local_10);
    }
  }
  NegativeTestContext::endSection(local_10);
  return;
}

Assistant:

void texture_size_invalid_sampler (NegativeTestContext& ctx)
{
	ctx.beginSection("textureSize: Invalid sampler type - some overloads take two arguments while others take only one.");
	for (int shaderNdx = 0; shaderNdx < DE_LENGTH_OF_ARRAY(s_shaders); ++shaderNdx)
	{
		if (ctx.isShaderSupported(s_shaders[shaderNdx]))
		{
			ctx.beginSection("Verify shader: " + std::string(getShaderTypeName(s_shaders[shaderNdx])));
			for (int dataTypeNdx = 0; dataTypeNdx < DE_LENGTH_OF_ARRAY(s_samplerTypes); ++dataTypeNdx)
			{
				if (contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2)) || ctx.isExtensionSupported(getDataTypeExtension(s_samplerTypes[dataTypeNdx])))
				{
					ctx.beginSection("Verify sampler data type: " + std::string(getDataTypeName(s_samplerTypes[dataTypeNdx])));
					const std::string shaderSource(genShaderSourceTextureSize_sampler(ctx, s_shaders[shaderNdx], s_samplerTypes[dataTypeNdx], glu::TYPE_INT));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					ctx.endSection();
				}
			}
			ctx.endSection();
		}
	}
	ctx.endSection();
}